

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

Aig_Man_t * Aig_ManSclPart(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fVerbose)

{
  undefined8 uVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar3;
  Aig_Man_t *pAVar4;
  undefined4 in_register_0000000c;
  int i;
  uint i_00;
  int nCountPis;
  int *pMapBack;
  int local_54;
  int local_50;
  int nCountRegs;
  Vec_Ptr_t *local_48;
  undefined8 local_40;
  Aig_Man_t *local_38;
  
  local_40 = CONCAT44(in_register_0000000c,fVerbose);
  local_54 = fLatchConst;
  local_50 = fLatchEqual;
  if (pAig->vClockDoms == (Vec_Vec_t *)0x0) {
    p = Aig_ManRegPartitionSimple(pAig,0,0);
  }
  else {
    p = Vec_PtrAlloc(100);
    for (i = 0; i < ((Vec_Ptr_t *)pAig->vClockDoms)->nSize; i = i + 1) {
      pVVar3 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)pAig->vClockDoms,i);
      pVVar3 = Vec_IntDup(pVVar3);
      Vec_PtrPush(p,pVVar3);
    }
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  uVar1 = local_40;
  local_48 = p;
  for (i_00 = 0; (int)i_00 < p->nSize; i_00 = i_00 + 1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p,i_00);
    pAVar4 = Aig_ManRegCreatePart(pAig,pVVar3,&nCountPis,&nCountRegs,&pMapBack);
    Aig_ManSetRegNum(pAVar4,pAVar4->nRegs);
    if (0 < nCountPis) {
      local_38 = Aig_ManScl(pAVar4,local_54,local_50,0,-1,-1,(int)uVar1,0);
      uVar2 = Aig_TransferMappedClasses(pAig,pAVar4,pMapBack);
      if ((int)uVar1 != 0) {
        printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n"
               ,(ulong)i_00,(ulong)(uint)pVVar3->nSize,
               (ulong)(uint)(pAVar4->nObjs[2] - pVVar3->nSize),(ulong)(uint)nCountPis,
               (ulong)(uint)nCountRegs,(ulong)(uint)(pAVar4->nObjs[6] + pAVar4->nObjs[5]),0,
               (ulong)uVar2);
      }
      Aig_ManStop(local_38);
      p = local_48;
    }
    Aig_ManStop(pAVar4);
    if (pMapBack != (int *)0x0) {
      free(pMapBack);
      pMapBack = (int *)0x0;
    }
  }
  pAVar4 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar4);
  Vec_VecFree((Vec_Vec_t *)p);
  return pAVar4;
}

Assistant:

Aig_Man_t * Aig_ManSclPart( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fVerbose ) 
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, nCountPis, nCountRegs;
    int * pMapBack;
    Aig_Man_t * pTemp, * pNew;
    int nClasses;

    if ( pAig->vClockDoms ) 
    {
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
            Vec_PtrPush( vResult, Vec_IntDup(vPart) );
    } 
    else
        vResult = Aig_ManRegPartitionSimple( pAig, 0, 0 );

    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i ) 
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        Aig_ManSetRegNum( pTemp, pTemp->nRegs );
        if (nCountPis>0) 
        {
            pNew = Aig_ManScl( pTemp, fLatchConst, fLatchEqual, 0, -1, -1, fVerbose, 0 );
            nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
            if ( fVerbose )
                printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n",
                        i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), 0, nClasses );
            Aig_ManStop( pNew );
        }
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
    Vec_VecFree( (Vec_Vec_t*)vResult );
    return pNew;
}